

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool plutosvg_document_render
                (plutosvg_document_t *document,char *id,plutovg_canvas_t *canvas,
                plutovg_color_t *current_color,plutosvg_palette_func_t palette_func,void *closure)

{
  undefined1 local_d8 [8];
  render_context_t context;
  element_t *element;
  string_t name;
  undefined1 local_88 [8];
  render_state_t state;
  void *closure_local;
  plutosvg_palette_func_t palette_func_local;
  plutovg_color_t *current_color_local;
  plutovg_canvas_t *canvas_local;
  char *id_local;
  plutosvg_document_t *document_local;
  
  local_88 = (undefined1  [8])0x0;
  state.element._0_4_ = 0;
  state.element._4_4_ = 0x3f800000;
  name.length._0_4_ = 0;
  name.length._4_4_ = 0;
  state.matrix.e = 0.0;
  state.matrix.f = 0.0;
  state.extents.x = -1.0;
  state.extents.y = -1.0;
  state.mode = (render_mode_t)document->width;
  state.opacity = document->height;
  state.extents._8_8_ = closure;
  plutovg_canvas_get_matrix(canvas,(plutovg_matrix_t *)&state.view_width);
  if (id == (char *)0x0) {
    state.parent = (render_state *)document->root_element;
  }
  else {
    element = (element_t *)id;
    name.data = (char *)strlen(id);
    context.closure = find_element(document,(string_t *)&element);
    state.parent = (render_state *)context.closure;
    if ((render_state *)context.closure == (render_state *)0x0) {
      return false;
    }
  }
  context.palette_func = (plutosvg_palette_func_t)state.extents._8_8_;
  local_d8 = (undefined1  [8])document;
  context.document = (plutosvg_document_t *)canvas;
  context.canvas = (plutovg_canvas_t *)current_color;
  context.current_color = (plutovg_color_t *)palette_func;
  render_element((element_t *)state.parent,(render_context_t *)local_d8,(render_state_t *)local_88);
  return true;
}

Assistant:

bool plutosvg_document_render(const plutosvg_document_t* document, const char* id, plutovg_canvas_t* canvas, const plutovg_color_t* current_color, plutosvg_palette_func_t palette_func, void* closure)
{
    render_state_t state;
    state.parent = NULL;
    state.mode = render_mode_painting;
    state.opacity = 1.f;
    state.extents = INVALID_RECT;
    state.view_width = document->width;
    state.view_height = document->height;
    plutovg_canvas_get_matrix(canvas, &state.matrix);
    if(id == NULL) {
        state.element = document->root_element;
    } else {
        const string_t name = {id, strlen(id)};
        const element_t* element = find_element(document, &name);
        if(element == NULL)
            return false;
        state.element = element;
    }

    render_context_t context = {document, canvas, current_color, palette_func, closure};
    render_element(state.element, &context, &state);
    return true;
}